

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::UnitTestImpl::AddTestInfo
          (UnitTestImpl *this,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestInfo *test_info)

{
  bool bVar1;
  ostream *poVar2;
  char *test_case_name;
  char *type_param;
  TestCase *this_00;
  GTestLog local_58 [4];
  FilePath local_48;
  TestInfo *local_28;
  TestInfo *test_info_local;
  TearDownTestCaseFunc tear_down_tc_local;
  SetUpTestCaseFunc set_up_tc_local;
  UnitTestImpl *this_local;
  
  local_28 = test_info;
  test_info_local = (TestInfo *)tear_down_tc;
  tear_down_tc_local = set_up_tc;
  set_up_tc_local = (SetUpTestCaseFunc)this;
  bVar1 = FilePath::IsEmpty(&this->original_working_dir_);
  if (bVar1) {
    FilePath::GetCurrentDir();
    FilePath::Set(&this->original_working_dir_,&local_48);
    FilePath::~FilePath(&local_48);
    bVar1 = FilePath::IsEmpty(&this->original_working_dir_);
    bVar1 = IsTrue((bool)((bVar1 ^ 0xffU) & 1));
    if (!bVar1) {
      GTestLog::GTestLog(local_58,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/lib/googletest-master/googletest/src/gtest-internal-inl.h"
                         ,0x291);
      poVar2 = GTestLog::GetStream(local_58);
      poVar2 = std::operator<<(poVar2,"Condition !original_working_dir_.IsEmpty() failed. ");
      std::operator<<(poVar2,"Failed to get the current working directory.");
      GTestLog::~GTestLog(local_58);
    }
  }
  test_case_name = TestInfo::test_case_name(local_28);
  type_param = TestInfo::type_param(local_28);
  this_00 = GetTestCase(this,test_case_name,type_param,tear_down_tc_local,
                        (TearDownTestCaseFunc)test_info_local);
  TestCase::AddTestInfo(this_00,local_28);
  return;
}

Assistant:

void AddTestInfo(Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc,
                   TestInfo* test_info) {
    // In order to support thread-safe death tests, we need to
    // remember the original working directory when the test program
    // was first invoked.  We cannot do this in RUN_ALL_TESTS(), as
    // the user may have changed the current directory before calling
    // RUN_ALL_TESTS().  Therefore we capture the current directory in
    // AddTestInfo(), which is called to register a TEST or TEST_F
    // before main() is reached.
    if (original_working_dir_.IsEmpty()) {
      original_working_dir_.Set(FilePath::GetCurrentDir());
      GTEST_CHECK_(!original_working_dir_.IsEmpty())
          << "Failed to get the current working directory.";
    }

    GetTestCase(test_info->test_case_name(),
                test_info->type_param(),
                set_up_tc,
                tear_down_tc)->AddTestInfo(test_info);
  }